

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkconnectionchannel_p.cpp
# Opt level: O0

int __thiscall
QHttpNetworkConnectionChannel::qt_metacall
          (QHttpNetworkConnectionChannel *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  void **in_RDI;
  QObject *unaff_retaddr;
  undefined4 local_18;
  int in_stack_fffffffffffffff8;
  Call in_stack_fffffffffffffffc;
  
  local_18 = QObject::qt_metacall((Call)in_RDI,in_ESI,(void **)(ulong)in_EDX);
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 0xe) {
        qt_static_metacall(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,in_RDI)
        ;
      }
      local_18 = local_18 + -0xe;
    }
    if (in_ESI == 7) {
      if (local_18 < 0xe) {
        qt_static_metacall(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,in_RDI)
        ;
      }
      local_18 = local_18 + -0xe;
    }
  }
  return local_18;
}

Assistant:

int QHttpNetworkConnectionChannel::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 14)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 14;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 14)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 14;
    }
    return _id;
}